

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

bool __thiscall test_case::eval_grad(test_case *this,ggml_backend_t backend,char *op_name)

{
  float fVar1;
  FILE *pFVar2;
  allocator_type *paVar3;
  int *piVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  pointer pgVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  pointer pgVar15;
  size_type sVar16;
  const_reference pvVar17;
  pointer pgVar18;
  reference pvVar19;
  size_type sVar20;
  float *pfVar21;
  long in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [12];
  double err;
  float fd;
  float fdh;
  float fuh;
  float fu;
  float xid;
  float xidh;
  float xiuh;
  float xiu;
  int64_t i_1;
  float eps;
  vector<float,_std::allocator<float>_> x0;
  vector<float,_std::allocator<float>_> gn;
  int64_t i;
  ggml_tensor *grad;
  vector<float,_std::allocator<float>_> ga;
  int64_t ne;
  char *bn;
  ggml_tensor *t_4;
  bool ok;
  ggml_status status;
  ggml_backend_buffer_ptr buf;
  ggml_tensor *t_3;
  ggml_tensor *t_2;
  ggml_tensor *t_1;
  int64_t ngrads;
  ggml_tensor *t;
  bool any_params;
  bool supported;
  ggml_tensor *out;
  ggml_context_ptr ctx;
  ggml_init_params params;
  vector<float,_std::allocator<float>_> expect;
  undefined4 uVar25;
  undefined4 uVar26;
  vector<float,_std::allocator<float>_> *__x;
  allocator_type *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb30;
  vector<float,_std::allocator<float>_> *pvVar27;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb48;
  double in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  float local_208;
  float local_204;
  float local_200;
  float local_1fc;
  size_type local_1f8;
  float local_1ec;
  vector<float,_std::allocator<float>_> local_1e8;
  vector<float,_std::allocator<float>_> local_1c8;
  size_type local_1b0;
  long local_190;
  vector<float,_std::allocator<float>_> local_188;
  long local_170;
  undefined8 local_168;
  allocator_type *local_160;
  byte local_155;
  int local_154;
  int *local_148;
  long local_140;
  long local_138;
  long local_130;
  string local_128 [32];
  int *local_108;
  byte local_fa;
  byte local_f9;
  string local_f8 [32];
  string local_d8 [32];
  int local_b8;
  byte local_b1;
  string local_b0 [32];
  int *local_90;
  pointer local_88;
  undefined8 uStack_80;
  vector<float,_std::allocator<float>_> *local_78;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  vector<float,_std::allocator<float>_> local_38;
  long local_20;
  undefined8 local_18;
  byte local_1;
  
  *(undefined4 *)(in_RDI + 3) = 2;
  local_20 = in_RDX;
  local_18 = in_RSI;
  (**(code **)(*in_RDI + 0x50))(&local_38);
  lVar10 = ggml_tensor_overhead();
  lVar11 = ggml_graph_overhead_custom(0x800,1);
  local_88 = (pointer)(lVar10 * 0x80 + lVar11 * 2);
  uStack_48 = 0;
  local_40 = 1;
  __x = (vector<float,_std::allocator<float>_> *)CONCAT71(uStack_3f,1);
  uStack_80 = 0;
  uStack_80._0_4_ = 0;
  uStack_80._4_4_ = 0;
  uVar25 = (undefined4)uStack_80;
  uVar26 = uStack_80._4_4_;
  local_78 = __x;
  pgVar18 = local_88;
  ggml_init();
  std::unique_ptr<ggml_context,ggml_context_deleter>::unique_ptr<ggml_context_deleter,void>
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25),pgVar18);
  bVar5 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ggml_context,_ggml_context_deleter> *)0x133951);
  if (!bVar5) {
    auVar24 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                         ,0x2f7,"GGML_ASSERT(%s) failed","ctx");
LAB_00135325:
    local_5c = auVar24._8_4_;
    local_58 = auVar24._0_8_;
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20);
    _Unwind_Resume(local_58);
  }
  pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                      ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
  lVar10 = ggml_new_graph_custom(pgVar12,0x800,1);
  in_RDI[1] = lVar10;
  pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                      ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
  lVar10 = ggml_new_graph_custom(pgVar12,0x800,1);
  in_RDI[2] = lVar10;
  pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                      ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
  local_90 = (int *)(**(code **)(*in_RDI + 0x20))(in_RDI,pgVar12);
  local_b1 = 0;
  if (local_20 == 0) {
LAB_00133ac5:
    bVar5 = local_90[0x14] == 0x51;
  }
  else {
    (**(code **)(*in_RDI + 0x10))(local_b0,in_RDI,local_90);
    local_b1 = 1;
    bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(uVar26,uVar25),(char *)pgVar18);
    bVar5 = true;
    if (!bVar6) goto LAB_00133ac5;
  }
  if ((local_b1 & 1) != 0) {
    std::__cxx11::string::~string(local_b0);
  }
  if (bVar5) {
    local_1 = 1;
    local_b8 = 1;
    goto LAB_001352ed;
  }
  (**(code **)(*in_RDI + 0x10))(local_d8,in_RDI,local_90);
  uVar13 = std::__cxx11::string::c_str();
  (**(code **)(*in_RDI + 0x18))(local_f8);
  uVar14 = std::__cxx11::string::c_str();
  printf("  %s(%s): ",uVar13,uVar14);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d8);
  fflush(_stdout);
  if (*local_90 != 0) {
    printf("not supported [%s->type != FP32]\n",local_90 + 0x40);
    local_1 = 1;
    local_b8 = 1;
    goto LAB_001352ed;
  }
  local_f9 = 1;
  local_fa = 0;
  pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                      ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
  for (local_108 = (int *)ggml_get_first_tensor(pgVar12); local_108 != (int *)0x0;
      local_108 = (int *)ggml_get_next_tensor(pgVar12,local_108)) {
    bVar7 = ggml_backend_supports_op(local_18,local_108);
    if ((bVar7 & 1) == 0) {
      uVar13 = ggml_backend_name(local_18);
      printf("not supported [%s] ",uVar13);
      local_f9 = 0;
      break;
    }
    if (((local_108[0x25] & 4U) != 0) && (local_fa = 1, *local_108 != 0)) {
      printf("not supported [%s->type != FP32] ",local_108 + 0x40);
      local_f9 = 0;
      break;
    }
    pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                        ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
  }
  if ((local_fa & 1) == 0) {
    (**(code **)(*in_RDI + 0x10))(local_128,in_RDI,local_90);
    uVar13 = std::__cxx11::string::c_str();
    printf("not supported [%s] \n",uVar13);
    std::__cxx11::string::~string(local_128);
    local_f9 = 0;
  }
  if ((local_f9 & 1) == 0) {
    printf("\n");
    local_1 = 1;
    local_b8 = 1;
    goto LAB_001352ed;
  }
  local_130 = 0;
  pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                      ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
  for (local_138 = ggml_get_first_tensor(pgVar12); lVar10 = local_130, local_138 != 0;
      local_138 = ggml_get_next_tensor(pgVar12,local_138)) {
    if ((*(uint *)(local_138 + 0x94) & 4) != 0) {
      lVar10 = ggml_nelements(local_138);
      local_130 = lVar10 + local_130;
    }
    pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                        ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
  }
  lVar11 = (**(code **)(*in_RDI + 0x48))();
  if (lVar11 < lVar10) {
    printf("skipping large tensors for speed \n");
    local_1 = 1;
    local_b8 = 1;
    goto LAB_001352ed;
  }
  bVar7 = ggml_is_scalar(local_90);
  if ((bVar7 & 1) == 0) {
    pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                        ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
    local_90 = (int *)ggml_sum(pgVar12,local_90);
    ggml_set_name(local_90,"sum_of_out");
  }
  ggml_set_loss(local_90);
  ggml_build_forward_expand(in_RDI[1],local_90);
  ggml_graph_cpy(in_RDI[1],in_RDI[2]);
  pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                      ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
  pgVar15 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                      ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
  ggml_build_backward_expand(pgVar12,pgVar15,in_RDI[2],0);
  sVar16 = std::vector<float,_std::allocator<float>_>::size(&local_38);
  if (sVar16 == 1) {
    pvVar17 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,0);
    if ((*pvVar17 != 0.0) || (NAN(*pvVar17))) goto LAB_001340d0;
  }
  else {
LAB_001340d0:
    iVar8 = ggml_graph_n_nodes(in_RDI[2]);
    iVar9 = ggml_graph_n_nodes(in_RDI[1]);
    if (iVar8 <= iVar9) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                 ,0x33c,"GGML_ASSERT(%s) failed","ggml_graph_n_nodes(gb) > ggml_graph_n_nodes(gf)");
    }
    pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                        ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
    for (local_140 = ggml_get_first_tensor(pgVar12); local_140 != 0;
        local_140 = ggml_get_next_tensor(pgVar12,local_140)) {
      if (((*(uint *)(local_140 + 0x94) & 4) != 0) &&
         (lVar10 = ggml_graph_get_grad(in_RDI[2],local_140), *(int *)(lVar10 + 0x50) == 0)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                   ,0x33e,"GGML_ASSERT(%s) failed",
                   "!(t->flags & GGML_TENSOR_FLAG_PARAM) || ggml_graph_get_grad(gb, t)->op != GGML_OP_NONE"
                  );
      }
      pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                          ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25)
                          );
    }
  }
  pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                      ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
  for (local_148 = (int *)ggml_get_first_tensor(pgVar12); local_148 != (int *)0x0;
      local_148 = (int *)ggml_get_next_tensor(pgVar12,local_148)) {
    bVar7 = ggml_backend_supports_op(local_18,local_148);
    if ((bVar7 & 1) == 0) {
      uVar13 = ggml_backend_name(local_18);
      printf("not supported [%s] ",uVar13);
      local_f9 = 0;
      break;
    }
    if (((local_148[0x25] & 4U) != 0) && (*local_148 != 0)) {
      printf("not supported [%s->type != FP32] ",local_148 + 0x40);
      local_f9 = 0;
      break;
    }
    pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                        ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
  }
  if ((local_f9 & 1) == 0) {
    printf("\n");
    local_1 = 1;
    local_b8 = 1;
  }
  else {
    pgVar12 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                        ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
    ggml_backend_alloc_ctx_tensors(pgVar12,local_18);
    std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>::
    unique_ptr<ggml_backend_buffer_deleter,void>
              ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)
               CONCAT44(uVar26,uVar25),(pointer)pgVar18);
    bVar5 = std::operator==((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)
                            CONCAT44(uVar26,uVar25),pgVar18);
    if (bVar5) {
      uVar13 = ggml_backend_name(local_18);
      printf("failed to allocate tensors [%s] ",uVar13);
      local_1 = 0;
      local_b8 = 1;
    }
    else {
      pgVar18 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                          ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25)
                          );
      (**(code **)(*in_RDI + 0x58))(in_RDI,pgVar18);
      ggml_graph_reset(in_RDI[2]);
      local_154 = ggml_backend_graph_compute(local_18,in_RDI[1]);
      pFVar2 = _stderr;
      if (local_154 == 0) {
        local_154 = ggml_backend_graph_compute(local_18,in_RDI[2]);
        pFVar2 = _stderr;
        if (local_154 == 0) {
          local_155 = 1;
          pgVar18 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                              ((unique_ptr<ggml_context,_ggml_context_deleter> *)
                               CONCAT44(uVar26,uVar25));
          local_160 = (allocator_type *)ggml_get_first_tensor(pgVar18);
          while (local_160 != (allocator_type *)0x0) {
            if ((*(uint *)(local_160 + 0x94) & 4) != 0) {
              local_168 = ggml_backend_name(local_18);
              local_170 = ggml_nelements(local_160);
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)0x134665);
              local_190 = ggml_graph_get_grad(in_RDI[2],local_160);
              if (local_190 == 0) {
                std::vector<float,_std::allocator<float>_>::resize
                          (in_stack_fffffffffffffb30,
                           CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
              }
              else {
                tensor_to_float((ggml_tensor *)
                                CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
                std::vector<float,_std::allocator<float>_>::operator=
                          ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20,__x);
                std::vector<float,_std::allocator<float>_>::~vector
                          ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20);
              }
              for (local_1b0 = 0; (long)local_1b0 < local_170; local_1b0 = local_1b0 + 1) {
                pvVar19 = std::vector<float,_std::allocator<float>_>::operator[]
                                    (&local_188,local_1b0);
                in_stack_fffffffffffffc7f = std::isfinite(*pvVar19);
                if (!(bool)in_stack_fffffffffffffc7f) {
                  uVar14 = ggml_op_desc(local_160);
                  uVar13 = local_168;
                  sVar16 = local_1b0;
                  pvVar19 = std::vector<float,_std::allocator<float>_>::operator[]
                                      (&local_188,local_1b0);
                  printf("[%s] nonfinite gradient at index %ld (%s=%f) ",SUB84((double)*pvVar19,0),
                         uVar14,sVar16,uVar13);
                  local_155 = 0;
                  break;
                }
              }
              if ((local_155 & 1) != 0) {
                std::allocator<float>::allocator((allocator<float> *)0x134842);
                std::vector<float,_std::allocator<float>_>::vector
                          (in_stack_fffffffffffffb30,
                           CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                           in_stack_fffffffffffffb20);
                std::allocator<float>::~allocator((allocator<float> *)0x13486e);
                sVar16 = std::vector<float,_std::allocator<float>_>::size(&local_188);
                sVar20 = std::vector<float,_std::allocator<float>_>::size(&local_1c8);
                if (sVar16 == sVar20) {
                  tensor_to_float((ggml_tensor *)
                                  CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
                  bVar7 = ggml_is_scalar(local_90);
                  if ((bVar7 & 1) != 0) {
                    if (*local_90 != 0) {
                      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                                 ,0x38a,"GGML_ASSERT(%s) failed","out->type == GGML_TYPE_F32");
                    }
                    local_1ec = (float)(**(code **)(*in_RDI + 0x38))();
                    for (local_1f8 = 0; (long)local_1f8 < local_170; local_1f8 = local_1f8 + 1) {
                      pvVar19 = std::vector<float,_std::allocator<float>_>::operator[]
                                          (&local_1e8,local_1f8);
                      local_1fc = local_1ec + *pvVar19;
                      pvVar19 = std::vector<float,_std::allocator<float>_>::operator[]
                                          (&local_1e8,local_1f8);
                      local_200 = local_1ec * 0.5 + *pvVar19;
                      pvVar19 = std::vector<float,_std::allocator<float>_>::operator[]
                                          (&local_1e8,local_1f8);
                      local_204 = local_1ec * -0.5 + *pvVar19;
                      pvVar19 = std::vector<float,_std::allocator<float>_>::operator[]
                                          (&local_1e8,local_1f8);
                      local_208 = *pvVar19 - local_1ec;
                      ggml_backend_tensor_set(local_160,&local_1fc,local_1f8 << 2,4);
                      local_154 = ggml_backend_graph_compute(local_18,in_RDI[1]);
                      piVar4 = local_90;
                      pFVar2 = _stderr;
                      if (local_154 != 0) {
                        uVar13 = ggml_status_to_string(local_154);
                        fprintf(pFVar2,"%s: ggml_backend_graph_compute failed. status=%s \n",
                                "eval_grad",uVar13);
                        local_1 = 0;
                        local_b8 = 1;
                        goto LAB_001351c7;
                      }
                      uVar13 = ggml_nbytes();
                      ggml_backend_tensor_get(piVar4,&local_20c,0,uVar13);
                      ggml_backend_tensor_set(local_160,&local_208,local_1f8 << 2,4);
                      local_154 = ggml_backend_graph_compute(local_18,in_RDI[1]);
                      piVar4 = local_90;
                      pFVar2 = _stderr;
                      if (local_154 != 0) {
                        uVar13 = ggml_status_to_string(local_154);
                        fprintf(pFVar2,"%s: ggml_backend_graph_compute failed. status=%s \n",
                                "eval_grad",uVar13);
                        local_1 = 0;
                        local_b8 = 1;
                        goto LAB_001351c7;
                      }
                      uVar13 = ggml_nbytes();
                      ggml_backend_tensor_get(piVar4,&local_218,0,uVar13);
                      bVar7 = (**(code **)(*in_RDI + 0x40))();
                      if ((bVar7 & 1) == 0) {
                        fVar22 = local_20c - local_218;
                        fVar23 = local_1ec * 2.0;
                        pvVar19 = std::vector<float,_std::allocator<float>_>::operator[]
                                            (&local_1c8,local_1f8);
                        *pvVar19 = fVar22 / fVar23;
                      }
                      else {
                        ggml_backend_tensor_set(local_160,&local_200,local_1f8 << 2,4);
                        local_154 = ggml_backend_graph_compute(local_18,in_RDI[1]);
                        piVar4 = local_90;
                        pFVar2 = _stderr;
                        if (local_154 != 0) {
                          uVar13 = ggml_status_to_string(local_154);
                          fprintf(pFVar2,"%s: ggml_backend_graph_compute failed. status=%s \n",
                                  "eval_grad",uVar13);
                          local_1 = 0;
                          local_b8 = 1;
                          goto LAB_001351c7;
                        }
                        uVar13 = ggml_nbytes();
                        ggml_backend_tensor_get(piVar4,&local_210,0,uVar13);
                        ggml_backend_tensor_set(local_160,&local_204,local_1f8 << 2,4);
                        local_154 = ggml_backend_graph_compute(local_18,in_RDI[1]);
                        piVar4 = local_90;
                        pFVar2 = _stderr;
                        if (local_154 != 0) {
                          uVar13 = ggml_status_to_string(local_154);
                          fprintf(pFVar2,"%s: ggml_backend_graph_compute failed. status=%s \n",
                                  "eval_grad",uVar13);
                          local_1 = 0;
                          local_b8 = 1;
                          goto LAB_001351c7;
                        }
                        uVar13 = ggml_nbytes();
                        ggml_backend_tensor_get(piVar4,&local_214,0,uVar13);
                        fVar1 = local_210 * 8.0 + local_218;
                        fVar23 = local_214 * 8.0 + local_20c;
                        fVar22 = local_1ec * 6.0;
                        pvVar19 = std::vector<float,_std::allocator<float>_>::operator[]
                                            (&local_1c8,local_1f8);
                        *pvVar19 = (fVar1 - fVar23) / fVar22;
                      }
                      paVar3 = local_160;
                      pfVar21 = std::vector<float,_std::allocator<float>_>::data
                                          ((vector<float,_std::allocator<float>_> *)0x135041);
                      uVar13 = ggml_nbytes(local_160);
                      ggml_backend_tensor_set(paVar3,pfVar21,0,uVar13);
                    }
                    pvVar27 = &local_1c8;
                    pfVar21 = std::vector<float,_std::allocator<float>_>::data
                                        ((vector<float,_std::allocator<float>_> *)0x1350a7);
                    std::vector<float,_std::allocator<float>_>::data
                              ((vector<float,_std::allocator<float>_> *)0x1350b9);
                    std::vector<float,_std::allocator<float>_>::size(pvVar27);
                    pvVar27 = (vector<float,_std::allocator<float>_> *)
                              mean_abs_asymm(pfVar21,(float *)pvVar27,
                                             (size_t)in_stack_fffffffffffffb50,
                                             in_stack_fffffffffffffb48);
                    in_stack_fffffffffffffb48 = pvVar27;
                    in_stack_fffffffffffffb50 = (double)(**(code **)(*in_RDI + 0x30))();
                    if ((double)in_stack_fffffffffffffb48 <= in_stack_fffffffffffffb50) {
                      if ((local_155 & 1) == 0) {
                        local_b8 = 0xe;
                      }
                      else {
                        local_b8 = 0;
                      }
                    }
                    else {
                      uVar14 = ggml_op_desc(local_160);
                      uVar13 = (**(code **)(*in_RDI + 0x30))();
                      printf("[%s] MAA = %.9f > %.9f ",(int)pvVar27,uVar13,uVar14);
                      local_155 = 0;
                      local_b8 = 0xe;
                      in_stack_fffffffffffffb30 = pvVar27;
                    }
LAB_001351c7:
                    std::vector<float,_std::allocator<float>_>::~vector
                              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20);
                    std::vector<float,_std::allocator<float>_>::~vector
                              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20);
                    goto LAB_001351e1;
                  }
                  auVar24 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                                       ,0x389,"GGML_ASSERT(%s) failed","ggml_is_scalar(out)");
                  local_5c = auVar24._8_4_;
                  local_58 = auVar24._0_8_;
                  std::vector<float,_std::allocator<float>_>::~vector
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20);
                  std::vector<float,_std::allocator<float>_>::~vector
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20);
                }
                else {
                  auVar24 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                                       ,0x386,"GGML_ASSERT(%s) failed","ga.size() == gn.size()");
                  local_5c = auVar24._8_4_;
                  local_58 = auVar24._0_8_;
                  std::allocator<float>::~allocator((allocator<float> *)0x1348e4);
                }
                std::vector<float,_std::allocator<float>_>::~vector
                          ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20);
                std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr
                          ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)
                           CONCAT44(uVar26,uVar25));
                std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
                          ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25)
                          );
                auVar24._8_4_ = local_5c;
                auVar24._0_8_ = local_58;
                goto LAB_00135325;
              }
              local_b8 = 0xe;
LAB_001351e1:
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20);
              if (local_b8 != 0) {
                if (local_b8 != 0xe) goto LAB_001352cf;
                break;
              }
              in_stack_fffffffffffffb2c = 0;
            }
            pgVar18 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                                ((unique_ptr<ggml_context,_ggml_context_deleter> *)
                                 CONCAT44(uVar26,uVar25));
            in_stack_fffffffffffffb20 = (allocator_type *)ggml_get_next_tensor(pgVar18,local_160);
            local_160 = in_stack_fffffffffffffb20;
          }
          if ((local_155 & 1) == 0) {
            printf("compare failed ");
          }
          if ((local_155 & 1) == 0) {
            printf("\x1b[1;31mFAIL\x1b[0m\n");
            local_1 = 0;
            local_b8 = 1;
          }
          else {
            printf("\x1b[1;32mOK\x1b[0m\n");
            local_1 = 1;
            local_b8 = 1;
          }
        }
        else {
          uVar13 = ggml_status_to_string(local_154);
          fprintf(pFVar2,"%s: ggml_backend_graph_compute failed. status=%s \n","eval_grad",uVar13);
          local_1 = 0;
          local_b8 = 1;
        }
      }
      else {
        uVar13 = ggml_status_to_string(local_154);
        fprintf(pFVar2,"%s: ggml_backend_graph_compute failed. status=%s \n","eval_grad",uVar13);
        local_1 = 0;
        local_b8 = 1;
      }
    }
LAB_001352cf:
    std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr
              ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)
               CONCAT44(uVar26,uVar25));
  }
LAB_001352ed:
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar26,uVar25));
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20);
  return (bool)(local_1 & 1);
}

Assistant:

bool eval_grad(ggml_backend_t backend, const char * op_name) {
        mode = MODE_GRAD;
        const std::vector<float> expect = grad_expect();

        ggml_init_params params = {
            /* .mem_size = */ ggml_tensor_overhead()*128 + 2*ggml_graph_overhead_custom(GGML_DEFAULT_GRAPH_SIZE, true),
            /* .mem_base = */ NULL,
            /* .no_alloc = */ true,
        };
        ggml_context_ptr ctx(ggml_init(params)); // smart ptr
        GGML_ASSERT(ctx);

        gf = ggml_new_graph_custom(ctx.get(), GGML_DEFAULT_GRAPH_SIZE, true);
        gb = ggml_new_graph_custom(ctx.get(), GGML_DEFAULT_GRAPH_SIZE, true);

        ggml_tensor * out = build_graph(ctx.get());

        if ((op_name != nullptr && op_desc(out) != op_name) || out->op == GGML_OP_OPT_STEP_ADAMW) {
            //printf("  %s: skipping\n", op_desc(out).c_str());
            return true;
        }

        printf("  %s(%s): ", op_desc(out).c_str(), vars().c_str());
        fflush(stdout);

        if (out->type != GGML_TYPE_F32) {
            printf("not supported [%s->type != FP32]\n", out->name);
            return true;
        }

        // check if the backend supports the ops
        bool supported = true;
        bool any_params = false;
        for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (!ggml_backend_supports_op(backend, t)) {
                printf("not supported [%s] ", ggml_backend_name(backend));
                supported = false;
                break;
            }
            if ((t->flags & GGML_TENSOR_FLAG_PARAM)) {
                any_params = true;
                if (t->type != GGML_TYPE_F32) {
                    printf("not supported [%s->type != FP32] ", t->name);
                    supported = false;
                    break;
                }
            }
        }
        if (!any_params) {
            printf("not supported [%s] \n", op_desc(out).c_str());
            supported = false;
        }
        if (!supported) {
            printf("\n");
            return true;
        }

        int64_t ngrads = 0;
        for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (t->flags & GGML_TENSOR_FLAG_PARAM) {
                ngrads += ggml_nelements(t);
            }
        }
        if (ngrads > grad_nmax()) {
            printf("skipping large tensors for speed \n");
            return true;
        }


        if (!ggml_is_scalar(out)) {
            out = ggml_sum(ctx.get(), out);
            ggml_set_name(out, "sum_of_out");
        }
        ggml_set_loss(out);

        ggml_build_forward_expand(gf, out);
        ggml_graph_cpy(gf, gb);
        ggml_build_backward_expand(ctx.get(), ctx.get(), gb, false);
        if (expect.size() != 1 || expect[0] != 0.0f) {
            GGML_ASSERT(ggml_graph_n_nodes(gb) > ggml_graph_n_nodes(gf));
            for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
                GGML_ASSERT(!(t->flags & GGML_TENSOR_FLAG_PARAM) || ggml_graph_get_grad(gb, t)->op != GGML_OP_NONE);
            }
        }

        for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (!ggml_backend_supports_op(backend, t)) {
                printf("not supported [%s] ", ggml_backend_name(backend));
                supported = false;
                break;
            }
            if ((t->flags & GGML_TENSOR_FLAG_PARAM) && t->type != GGML_TYPE_F32) {
                printf("not supported [%s->type != FP32] ", t->name);
                supported = false;
                break;
            }
        }
        if (!supported) {
            printf("\n");
            return true;
        }

        // allocate
        ggml_backend_buffer_ptr buf(ggml_backend_alloc_ctx_tensors(ctx.get(), backend)); // smart ptr
        if (buf == NULL) {
            printf("failed to allocate tensors [%s] ", ggml_backend_name(backend));
            return false;
        }

        initialize_tensors(ctx.get()); // Randomizes all tensors (including gradients).
        ggml_graph_reset(gb);    // Sets gradients to 1 if loss, 0 otherwise.

        ggml_status status = ggml_backend_graph_compute(backend, gf);
        if (status != GGML_STATUS_SUCCESS) {
            fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
            return false;
        }
        status = ggml_backend_graph_compute(backend, gb);
        if (status != GGML_STATUS_SUCCESS) {
            fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
            return false;
        }

        bool ok = true;
        for (struct ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != nullptr; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (!(t->flags & GGML_TENSOR_FLAG_PARAM)) {
                continue;
            }

            const char * bn = ggml_backend_name(backend);
            const int64_t ne = ggml_nelements(t);

            std::vector<float> ga;
            struct ggml_tensor * grad = ggml_graph_get_grad(gb, t);
            if (grad) {
                ga = tensor_to_float(grad);
            } else {
                ga.resize(ne); // default value is 0.0f
            }

            for (int64_t i = 0; i < ne; ++i) { // gradient algebraic
                // check for nans
                if (!std::isfinite(ga[i])) {
                    printf("[%s] nonfinite gradient at index %" PRId64 " (%s=%f) ", ggml_op_desc(t), i, bn, ga[i]);
                    ok = false;
                    break;
                }
            }
            if (!ok) {
                break;
            }

            std::vector<float> gn(ne); // gradient numeric
            GGML_ASSERT(ga.size() == gn.size());

            std::vector<float> x0 = tensor_to_float(t); // original t data
            GGML_ASSERT(ggml_is_scalar(out));
            GGML_ASSERT(out->type == GGML_TYPE_F32);

            const float eps = grad_eps();
            for (int64_t i = 0; i < ne; ++i) {
                const float xiu  = x0[i] + 1.0f*eps; // x, index i, up
                const float xiuh = x0[i] + 0.5f*eps; // x, index i, up half
                const float xidh = x0[i] - 0.5f*eps; // x, index i, down half
                const float xid  = x0[i] - 1.0f*eps; // x, index i, down

                float fu, fuh, fdh, fd; // output values for xiu, xiuh, xid, xidh

                ggml_backend_tensor_set(t, &xiu, i*sizeof(float), sizeof(float));
                status = ggml_backend_graph_compute(backend, gf);
                if (status != GGML_STATUS_SUCCESS) {
                    fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                    return false;
                }
                ggml_backend_tensor_get(out, &fu, 0, ggml_nbytes(out));

                ggml_backend_tensor_set(t, &xid, i*sizeof(float), sizeof(float));
                status = ggml_backend_graph_compute(backend, gf);
                if (status != GGML_STATUS_SUCCESS) {
                    fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                    return false;
                }
                ggml_backend_tensor_get(out, &fd, 0, ggml_nbytes(out));

                if (grad_precise()) {
                    ggml_backend_tensor_set(t, &xiuh, i*sizeof(float), sizeof(float));
                    status = ggml_backend_graph_compute(backend, gf);
                    if (status != GGML_STATUS_SUCCESS) {
                        fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                        return false;
                    }
                    ggml_backend_tensor_get(out, &fuh, 0, ggml_nbytes(out));

                    ggml_backend_tensor_set(t, &xidh, i*sizeof(float), sizeof(float));
                    status = ggml_backend_graph_compute(backend, gf);
                    if (status != GGML_STATUS_SUCCESS) {
                        fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                        return false;
                    }
                    ggml_backend_tensor_get(out, &fdh, 0, ggml_nbytes(out));

                    gn[i] = (8.0*(double)fuh + (double)fd - (8.0*(double)fdh + (double)fu)) / (6.0*(double)eps);
                } else {
                    gn[i] = (fu - fd) / (2.0f*eps);
                }

                ggml_backend_tensor_set(t, x0.data(), 0, ggml_nbytes(t));
            }

            const double err = mean_abs_asymm(gn.data(), ga.data(), gn.size(), expect);
            if (err > max_maa_err()) {
                printf("[%s] MAA = %.9f > %.9f ", ggml_op_desc(t), err, max_maa_err());
                ok = false;
                break;
            }
            if (!ok) {
                break;
            }
        }

        if (!ok) {
            printf("compare failed ");
        }

        if (ok) {
            printf("\033[1;32mOK\033[0m\n");
            return true;
        }

        printf("\033[1;31mFAIL\033[0m\n");
        return false;
    }